

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O2

size_t toml::detail::integer_width_base10(size_t i)

{
  size_t sVar1;
  
  sVar1 = 0;
  for (; i != 0; i = i / 10) {
    sVar1 = sVar1 + 1;
  }
  return sVar1;
}

Assistant:

TOML11_INLINE std::size_t integer_width_base10(std::size_t i) noexcept
{
    std::size_t width = 0;
    while(i != 0)
    {
        i /= 10;
        width += 1;
    }
    return width;
}